

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O3

Var __thiscall
Js::DynamicTypeHandler::GetSlot(DynamicTypeHandler *this,DynamicObject *instance,int index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *ptr;
  uint lineNumber;
  
  if (index < (int)(uint)this->inlineSlotCapacity) {
    ptr = *(void **)((long)&(&(instance->super_RecyclableObject).super_FinalizableObject)[index].
                            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
                    (ulong)this->offsetOfInlineSlots);
    bVar2 = ThreadContext::IsOnStack(instance);
    if (bVar2) {
      return ptr;
    }
    bVar2 = ThreadContext::IsOnStack(ptr);
    if (!bVar2) {
      return ptr;
    }
    bVar2 = VarIs<Js::RecyclableObject>(ptr);
    if (!bVar2) {
      return ptr;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    lineNumber = 0x5a;
  }
  else {
    ptr = (instance->auxSlots).ptr[(long)index - (ulong)this->inlineSlotCapacity].ptr;
    bVar2 = ThreadContext::IsOnStack(instance);
    if (bVar2) {
      return ptr;
    }
    bVar2 = ThreadContext::IsOnStack(ptr);
    if (!bVar2) {
      return ptr;
    }
    bVar2 = VarIs<Js::RecyclableObject>(ptr);
    if (!bVar2) {
      return ptr;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    lineNumber = 0x60;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                              ,lineNumber,
                              "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                              ,
                              "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                             );
  if (bVar2) {
    *puVar3 = 0;
    return ptr;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Var DynamicTypeHandler::GetSlot(DynamicObject * instance, int index)
    {
        if (index < inlineSlotCapacity)
        {
            Var * slots = reinterpret_cast<Var*>(reinterpret_cast<size_t>(instance) + offsetOfInlineSlots);
            Var value = slots[index];
            Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
            return value;
        }
        else
        {
            Var value = instance->auxSlots[index - inlineSlotCapacity];
            Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
            return value;
        }
    }